

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O2

int archive_compressor_compress_write(archive_write_filter *f,void *buff,size_t length)

{
  byte bVar1;
  uint ocode;
  long *plVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  bool bVar9;
  
  iVar4 = 0;
  if (length != 0) {
    plVar2 = (long *)f->data;
    if (*plVar2 == 0) {
      bVar1 = *buff;
      buff = (void *)((long)buff + 1);
      *(uint *)((long)plVar2 + 0x65164) = (uint)bVar1;
      *plVar2 = 1;
      length = length - 1;
    }
LAB_0058a668:
    do {
      while( true ) {
        bVar9 = length == 0;
        length = length - 1;
        if (bVar9) {
          return 0;
        }
        bVar1 = *buff;
        buff = (void *)((long)buff + 1);
        *plVar2 = *plVar2 + 1;
        ocode = *(uint *)((long)plVar2 + 0x65164);
        uVar3 = (uint)bVar1 << 0x10 | ocode;
        *(uint *)(plVar2 + 0xca2d) = uVar3;
        uVar8 = ocode ^ (uint)bVar1 << 8;
        uVar6 = *(uint *)((long)plVar2 + (long)(int)uVar8 * 4 + 0x24);
        if (uVar6 != uVar3) break;
        *(uint *)((long)plVar2 + 0x65164) =
             (uint)*(ushort *)((long)plVar2 + (long)(int)uVar8 * 2 + 0x43648);
      }
      if (-1 < (int)uVar6) {
        iVar4 = uVar8 - 0x10d89;
        if ((uint)bVar1 << 8 == ocode) {
          iVar4 = -1;
        }
        do {
          uVar6 = uVar8 + iVar4;
          uVar8 = uVar8 + 0x10d89 + iVar4;
          if (-1 < (int)uVar6) {
            uVar8 = uVar6;
          }
          uVar6 = *(uint *)((long)plVar2 + 0x24 + (long)(int)uVar8 * 4);
          if (uVar6 == uVar3) {
            *(uint *)((long)plVar2 + 0x65164) =
                 (uint)*(ushort *)((long)plVar2 + (long)(int)uVar8 * 2 + 0x43648);
            goto LAB_0058a668;
          }
        } while (-1 < (int)uVar6);
      }
      iVar4 = output_code(f,ocode);
      if (iVar4 != 0) {
        return iVar4;
      }
      *(uint *)((long)plVar2 + 0x65164) = (uint)bVar1;
      iVar4 = *(int *)((long)plVar2 + 0x6515c);
      if (iVar4 < (int)plVar2[4]) {
        *(int *)((long)plVar2 + 0x6515c) = iVar4 + 1;
        *(short *)((long)plVar2 + (long)(int)uVar8 * 2 + 0x43648) = (short)iVar4;
        *(int *)((long)plVar2 + (long)(int)uVar8 * 4 + 0x24) = (int)plVar2[0xca2d];
        goto LAB_0058a668;
      }
      lVar5 = *plVar2;
      if (lVar5 < plVar2[2]) goto LAB_0058a668;
      plVar2[2] = lVar5 + 10000;
      lVar7 = plVar2[1];
      if (lVar5 < 0x800000) {
        if (lVar7 != 0) {
          lVar5 = lVar5 << 8;
          goto LAB_0058a788;
        }
LAB_0058a792:
        iVar4 = 0x7fffffff;
      }
      else {
        iVar4 = (int)(lVar7 / 0x100);
        if (iVar4 == 0) goto LAB_0058a792;
        lVar7 = (long)iVar4;
LAB_0058a788:
        iVar4 = (int)(lVar5 / lVar7);
      }
      if ((int)plVar2[0xca2c] < iVar4) {
        *(int *)(plVar2 + 0xca2c) = iVar4;
        goto LAB_0058a668;
      }
      *(undefined4 *)(plVar2 + 0xca2c) = 0;
      memset((void *)((long)plVar2 + 0x24),0xff,0x43624);
      *(undefined4 *)((long)plVar2 + 0x6515c) = 0x101;
      iVar4 = output_code(f,0x100);
    } while (iVar4 == 0);
  }
  return iVar4;
}

Assistant:

static int
archive_compressor_compress_write(struct archive_write_filter *f,
    const void *buff, size_t length)
{
	struct private_data *state = (struct private_data *)f->data;
	int i;
	int ratio;
	int c, disp, ret;
	const unsigned char *bp;

	if (length == 0)
		return ARCHIVE_OK;

	bp = buff;

	if (state->in_count == 0) {
		state->cur_code = *bp++;
		++state->in_count;
		--length;
	}

	while (length--) {
		c = *bp++;
		state->in_count++;
		state->cur_fcode = (c << 16) | state->cur_code;
		i = ((c << HSHIFT) ^ state->cur_code);	/* Xor hashing. */

		if (state->hashtab[i] == state->cur_fcode) {
			state->cur_code = state->codetab[i];
			continue;
		}
		if (state->hashtab[i] < 0)	/* Empty slot. */
			goto nomatch;
		/* Secondary hash (after G. Knott). */
		if (i == 0)
			disp = 1;
		else
			disp = HSIZE - i;
 probe:
		if ((i -= disp) < 0)
			i += HSIZE;

		if (state->hashtab[i] == state->cur_fcode) {
			state->cur_code = state->codetab[i];
			continue;
		}
		if (state->hashtab[i] >= 0)
			goto probe;
 nomatch:
		ret = output_code(f, state->cur_code);
		if (ret != ARCHIVE_OK)
			return ret;
		state->cur_code = c;
		if (state->first_free < state->max_maxcode) {
			state->codetab[i] = state->first_free++;	/* code -> hashtable */
			state->hashtab[i] = state->cur_fcode;
			continue;
		}
		if (state->in_count < state->checkpoint)
			continue;

		state->checkpoint = state->in_count + CHECK_GAP;

		if (state->in_count <= 0x007fffff && state->out_count != 0)
			ratio = (int)(state->in_count * 256 / state->out_count);
		else if ((ratio = (int)(state->out_count / 256)) == 0)
			ratio = 0x7fffffff;
		else
			ratio = (int)(state->in_count / ratio);

		if (ratio > state->compress_ratio)
			state->compress_ratio = ratio;
		else {
			state->compress_ratio = 0;
			memset(state->hashtab, 0xff, sizeof(state->hashtab));
			state->first_free = FIRST;
			ret = output_code(f, CLEAR);
			if (ret != ARCHIVE_OK)
				return ret;
		}
	}

	return (ARCHIVE_OK);
}